

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O3

Scene * __thiscall CS248::DynamicScene::Scene::get_static_scene(Scene *this)

{
  _Base_ptr p_Var1;
  Scene *this_00;
  _Rb_tree_header *p_Var2;
  SceneObject *staticObject;
  vector<CS248::StaticScene::SceneLight_*,_std::allocator<CS248::StaticScene::SceneLight_*>_>
  staticLights;
  vector<CS248::StaticScene::SceneObject_*,_std::allocator<CS248::StaticScene::SceneObject_*>_>
  staticObjects;
  SceneLight *local_70;
  vector<CS248::StaticScene::SceneLight_*,_std::allocator<CS248::StaticScene::SceneLight_*>_>
  local_68;
  vector<CS248::StaticScene::SceneObject_*,_std::allocator<CS248::StaticScene::SceneObject_*>_>
  local_48;
  
  local_48.
  super__Vector_base<CS248::StaticScene::SceneObject_*,_std::allocator<CS248::StaticScene::SceneObject_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<CS248::StaticScene::SceneObject_*,_std::allocator<CS248::StaticScene::SceneObject_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (SceneObject **)0x0;
  local_48.
  super__Vector_base<CS248::StaticScene::SceneObject_*,_std::allocator<CS248::StaticScene::SceneObject_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (SceneObject **)0x0;
  local_68.
  super__Vector_base<CS248::StaticScene::SceneLight_*,_std::allocator<CS248::StaticScene::SceneLight_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (SceneLight **)0x0;
  local_68.
  super__Vector_base<CS248::StaticScene::SceneLight_*,_std::allocator<CS248::StaticScene::SceneLight_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<CS248::StaticScene::SceneLight_*,_std::allocator<CS248::StaticScene::SceneLight_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (SceneLight **)0x0;
  p_Var1 = (this->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var2 = &(this->objects)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var1 != p_Var2) {
    do {
      local_70 = (SceneLight *)(**(code **)(**(long **)(p_Var1 + 1) + 0x38))();
      if (local_70 != (SceneLight *)0x0) {
        if (local_48.
            super__Vector_base<CS248::StaticScene::SceneObject_*,_std::allocator<CS248::StaticScene::SceneObject_*>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_48.
            super__Vector_base<CS248::StaticScene::SceneObject_*,_std::allocator<CS248::StaticScene::SceneObject_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<CS248::StaticScene::SceneObject*,std::allocator<CS248::StaticScene::SceneObject*>>
          ::_M_realloc_insert<CS248::StaticScene::SceneObject*const&>
                    ((vector<CS248::StaticScene::SceneObject*,std::allocator<CS248::StaticScene::SceneObject*>>
                      *)&local_48,
                     (iterator)
                     local_48.
                     super__Vector_base<CS248::StaticScene::SceneObject_*,_std::allocator<CS248::StaticScene::SceneObject_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish,(SceneObject **)&local_70);
        }
        else {
          *local_48.
           super__Vector_base<CS248::StaticScene::SceneObject_*,_std::allocator<CS248::StaticScene::SceneObject_*>_>
           ._M_impl.super__Vector_impl_data._M_finish = (SceneObject *)local_70;
          local_48.
          super__Vector_base<CS248::StaticScene::SceneObject_*,_std::allocator<CS248::StaticScene::SceneObject_*>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_48.
               super__Vector_base<CS248::StaticScene::SceneObject_*,_std::allocator<CS248::StaticScene::SceneObject_*>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
      }
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1);
    } while ((_Rb_tree_header *)p_Var1 != p_Var2);
  }
  p_Var1 = (this->lights)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var2 = &(this->lights)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var1 != p_Var2) {
    do {
      local_70 = (SceneLight *)(**(code **)**(undefined8 **)(p_Var1 + 1))();
      if (local_68.
          super__Vector_base<CS248::StaticScene::SceneLight_*,_std::allocator<CS248::StaticScene::SceneLight_*>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_68.
          super__Vector_base<CS248::StaticScene::SceneLight_*,_std::allocator<CS248::StaticScene::SceneLight_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<CS248::StaticScene::SceneLight*,std::allocator<CS248::StaticScene::SceneLight*>>
        ::_M_realloc_insert<CS248::StaticScene::SceneLight*>
                  ((vector<CS248::StaticScene::SceneLight*,std::allocator<CS248::StaticScene::SceneLight*>>
                    *)&local_68,
                   (iterator)
                   local_68.
                   super__Vector_base<CS248::StaticScene::SceneLight_*,_std::allocator<CS248::StaticScene::SceneLight_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish,&local_70);
      }
      else {
        *local_68.
         super__Vector_base<CS248::StaticScene::SceneLight_*,_std::allocator<CS248::StaticScene::SceneLight_*>_>
         ._M_impl.super__Vector_impl_data._M_finish = local_70;
        local_68.
        super__Vector_base<CS248::StaticScene::SceneLight_*,_std::allocator<CS248::StaticScene::SceneLight_*>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_68.
             super__Vector_base<CS248::StaticScene::SceneLight_*,_std::allocator<CS248::StaticScene::SceneLight_*>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1);
    } while ((_Rb_tree_header *)p_Var1 != p_Var2);
  }
  this_00 = (Scene *)operator_new(0x30);
  StaticScene::Scene::Scene(this_00,&local_48,&local_68);
  if (local_68.
      super__Vector_base<CS248::StaticScene::SceneLight_*,_std::allocator<CS248::StaticScene::SceneLight_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.
                    super__Vector_base<CS248::StaticScene::SceneLight_*,_std::allocator<CS248::StaticScene::SceneLight_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_48.
      super__Vector_base<CS248::StaticScene::SceneObject_*,_std::allocator<CS248::StaticScene::SceneObject_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<CS248::StaticScene::SceneObject_*,_std::allocator<CS248::StaticScene::SceneObject_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return this_00;
}

Assistant:

StaticScene::Scene *Scene::get_static_scene() {
  std::vector<StaticScene::SceneObject *> staticObjects;
  std::vector<StaticScene::SceneLight *> staticLights;

  for (SceneObject *obj : objects) {
    auto staticObject = obj->get_static_object();
    if (staticObject != nullptr) staticObjects.push_back(staticObject);
  }
  for (SceneLight *light : lights) {
    staticLights.push_back(light->get_static_light());
  }

  return new StaticScene::Scene(staticObjects, staticLights);
}